

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

int av1_interinter_compound_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,int_mv *cur_mv,BLOCK_SIZE bsize,PREDICTION_MODE this_mode
              )

{
  PREDICTION_MODE PVar1;
  BLOCK_SIZE in_CL;
  INTERINTER_COMPOUND_DATA *in_RDX;
  int_mv *in_RSI;
  MACROBLOCK *in_RDI;
  byte in_R8B;
  AV1_COMP *unaff_retaddr;
  int *in_stack_00000010;
  int in_stack_00000018;
  int which;
  INTERINTER_COMPOUND_DATA *compound_data;
  int tmp_rate_mv;
  int_mv tmp_mv [2];
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined8 local_58;
  undefined4 local_38 [2];
  long local_30;
  int_mv *tmp_mv_00;
  
  tmp_mv_00 = in_RSI + 0x68;
  local_30 = **(long **)(in_RSI + 0x816);
  if (*(char *)(local_30 + 0x53) == '\0') {
    local_58 = 0;
  }
  else {
    local_58 = *(undefined8 *)(in_RSI + 0xaec);
  }
  *(undefined8 *)(local_30 + 0x48) = local_58;
  if (in_R8B == 0x18) {
    do_masked_motion_search_indexed
              (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_CL,tmp_mv_00,in_stack_00000010,
               in_stack_00000018);
    *(undefined4 *)(local_30 + 8) = local_38[0];
    *(undefined4 *)(local_30 + 0xc) = local_38[1];
  }
  else if ((0x12 < in_R8B) && (in_R8B < 0x17)) {
    PVar1 = compound_ref1_mode(in_R8B);
    do_masked_motion_search_indexed
              (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_CL,tmp_mv_00,in_stack_00000010,
               in_stack_00000018);
    *(undefined4 *)(local_30 + 8 + (long)(int)(uint)(PVar1 == '\x10') * 4) =
         local_38[(int)(uint)(PVar1 == '\x10')];
  }
  return 0;
}

Assistant:

int av1_interinter_compound_motion_search(const AV1_COMP *const cpi,
                                          MACROBLOCK *x,
                                          const int_mv *const cur_mv,
                                          const BLOCK_SIZE bsize,
                                          const PREDICTION_MODE this_mode) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int_mv tmp_mv[2];
  int tmp_rate_mv = 0;
  // TODO(jingning): The average compound mode has proper SAD and variance
  // functions implemented, and is triggerd by setting the mask pointer as
  // Null. Need to further implement those for frame distance weighted mode.
  mbmi->interinter_comp.seg_mask =
      mbmi->interinter_comp.type == COMPOUND_AVERAGE ? NULL : xd->seg_mask;
  const INTERINTER_COMPOUND_DATA *compound_data = &mbmi->interinter_comp;

  if (this_mode == NEW_NEWMV) {
    do_masked_motion_search_indexed(cpi, x, cur_mv, compound_data, bsize,
                                    tmp_mv, &tmp_rate_mv, 2);
    mbmi->mv[0].as_int = tmp_mv[0].as_int;
    mbmi->mv[1].as_int = tmp_mv[1].as_int;
  } else if (this_mode >= NEAREST_NEWMV && this_mode <= NEW_NEARMV) {
    // which = 1 if this_mode == NEAREST_NEWMV || this_mode == NEAR_NEWMV
    // which = 0 if this_mode == NEW_NEARESTMV || this_mode == NEW_NEARMV
    int which = (NEWMV == compound_ref1_mode(this_mode));
    do_masked_motion_search_indexed(cpi, x, cur_mv, compound_data, bsize,
                                    tmp_mv, &tmp_rate_mv, which);
    mbmi->mv[which].as_int = tmp_mv[which].as_int;
  }
  return tmp_rate_mv;
}